

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffextn(char *url,int *extension_num,int *status)

{
  int iVar1;
  char *pcVar2;
  int *status_00;
  int extnum;
  int tstatus;
  fitsfile *fptr;
  int hdutype;
  int extvers;
  char urltype [20];
  char imagecolname [71];
  char extspec [1025];
  char infile [1025];
  char binspec [1025];
  char extname [1025];
  char rowexpress [1025];
  char colspec [1025];
  char rowfilter [1025];
  char outfile [1025];
  int local_2120 [2];
  fitsfile *local_2118;
  int local_2110;
  int local_210c;
  long local_2108;
  char local_2100;
  char local_20e8 [80];
  char local_2098 [1040];
  char local_1c88 [1040];
  char local_1878 [1040];
  char local_1468 [1040];
  char local_1058 [1040];
  char local_c48 [1040];
  char local_838 [1040];
  char local_428 [1032];
  
  local_2120[1] = 0;
  if (0 < *status) {
    return *status;
  }
  ffifile2(url,(char *)&local_2108,local_1c88,local_428,local_2098,local_838,local_1878,local_c48,
           (char *)0x0,(char *)0x0,status);
  if (0 < *status) {
    return *status;
  }
  if (local_1878[0] == '\0') {
    if (local_2098[0] == '\0') {
      *extension_num = -99;
      goto LAB_0011006b;
    }
    ffexts(local_2098,local_2120,local_1468,&local_210c,&local_2110,local_20e8,local_1058,status);
    if (0 < *status) {
      return *status;
    }
    if (local_20e8[0] == '\0') {
      if (local_1468[0] != '\0') {
        if (local_2100 != '\0' || local_2108 != 0x2f2f3a6e69647473) {
          local_1c88[0] = '\0';
          strncat(local_1c88,url,0x400);
          pcVar2 = strchr(local_1c88,0x5d);
          if (pcVar2 != (char *)0x0) {
            pcVar2[1] = '\0';
            iVar1 = ffopen(&local_2118,local_1c88,0,status);
            if (iVar1 < 1) {
              ffghdn(local_2118,local_2120);
              *extension_num = local_2120[0];
              status_00 = status;
            }
            else {
              status_00 = local_2120 + 1;
            }
            ffclos(local_2118,status_00);
            goto LAB_0011006b;
          }
        }
        *status = 0x7d;
        return 0x7d;
      }
      *extension_num = local_2120[0] + 1;
      goto LAB_0011006b;
    }
  }
  *extension_num = 1;
LAB_0011006b:
  return *status;
}

Assistant:

int ffextn(char *url,           /* I - input filename/URL  */
           int *extension_num,  /* O - returned extension number */
           int *status)
{
/*
   Parse the input url string and return the number of the extension that
   CFITSIO would automatically move to if CFITSIO were to open this input URL.
   The extension numbers are one's based, so 1 = the primary array, 2 = the
   first extension, etc.

   The extension number that gets returned is determined by the following 
   algorithm:

   1. If the input URL includes a binning specification (e.g.
   'myfile.fits[3][bin X,Y]') then the returned extension number
   will always = 1, since CFITSIO would create a temporary primary
   image on the fly in this case.  The same is true if an image
   within a single cell of a binary table is opened.

   2.  Else if the input URL specifies an extension number (e.g.,
   'myfile.fits[3]' or 'myfile.fits+3') then the specified extension
   number (+ 1) is returned.  

   3.  Else if the extension name is specified in brackets
   (e.g., this 'myfile.fits[EVENTS]') then the file will be opened and searched
   for the extension number.  If the input URL is '-'  (reading from the stdin
   file stream) this is not possible and an error will be returned.

   4.  Else if the URL does not specify an extension (e.g. 'myfile.fits') then
   a special extension number = -99 will be returned to signal that no
   extension was specified.  This feature is mainly for compatibility with
   existing FTOOLS software.  CFITSIO would open the primary array by default
   (extension_num = 1) in this case.

*/
    fitsfile *fptr;
    char urltype[20];
    char infile[FLEN_FILENAME];
    char outfile[FLEN_FILENAME]; 
    char extspec[FLEN_FILENAME];
    char extname[FLEN_FILENAME];
    char rowfilter[FLEN_FILENAME];
    char binspec[FLEN_FILENAME];
    char colspec[FLEN_FILENAME];
    char imagecolname[FLEN_VALUE], rowexpress[FLEN_FILENAME];
    char *cptr;
    int extnum, extvers, hdutype, tstatus = 0;

    if (*status > 0)
        return(*status);

    /*  parse the input URL into its basic components  */
    fits_parse_input_url(url, urltype, infile, outfile,
             extspec, rowfilter,binspec, colspec, status);

    if (*status > 0)
        return(*status);

    if (*binspec)   /* is there a binning specification? */
    {
       *extension_num = 1; /* a temporary primary array image is created */
       return(*status);
    }

    if (*extspec)   /* is an extension specified? */
    {
       ffexts(extspec, &extnum, 
         extname, &extvers, &hdutype, imagecolname, rowexpress, status);

      if (*status > 0)
        return(*status);

      if (*imagecolname)   /* is an image within a table cell being opened? */
      {
         *extension_num = 1; /* a temporary primary array image is created */
         return(*status);
      }

      if (*extname)
      {
         /* have to open the file to search for the extension name (curses!) */

         if (!strcmp(urltype, "stdin://"))
            /* opening stdin would destroying it! */
            return(*status = URL_PARSE_ERROR); 

         /* First, strip off any filtering specification */
         infile[0] = '\0';
	 strncat(infile, url, FLEN_FILENAME -1);
	 
         cptr = strchr(infile, ']');  /* locate the closing bracket */
         if (!cptr)
         {
             return(*status = URL_PARSE_ERROR);
         }
         else
         {
             cptr++;
             *cptr = '\0'; /* terminate URl after the extension spec */
         }

         if (ffopen(&fptr, infile, READONLY, status) > 0) /* open the file */
         {
            ffclos(fptr, &tstatus);
            return(*status);
         }

         ffghdn(fptr, &extnum);    /* where am I in the file? */
         *extension_num = extnum;
         ffclos(fptr, status);

         return(*status);
      }
      else
      {
         *extension_num = extnum + 1;  /* return the specified number (+ 1) */
         return(*status);
      }
    }
    else
    {
         *extension_num = -99;  /* no specific extension was specified */
                                /* defaults to primary array */
         return(*status);
    }
}